

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char>
fmt::v7::detail::write<char,fmt::v7::detail::buffer_appender<char>>
          (buffer_appender<char> out,char *value)

{
  basic_string_view<char> value_00;
  char *message;
  size_t count;
  buffer_appender<char> bVar1;
  char *in_RSI;
  size_t in_RDI;
  size_t length;
  format_error *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_ffffffffffffffc8;
  
  if (in_RSI == (char *)0x0) {
    message = (char *)__cxa_allocate_exception(0x10);
    format_error::format_error(in_stack_ffffffffffffffb0,message);
    __cxa_throw(message,&format_error::typeinfo,format_error::~format_error);
  }
  count = std::char_traits<char>::length((char_type *)0x285362);
  basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)&stack0xffffffffffffffb0,in_RSI,count);
  value_00.size_ = in_RDI;
  value_00.data_ = in_stack_ffffffffffffffb8;
  bVar1 = write<char>((buffer_appender<char>)in_stack_ffffffffffffffc8.container,value_00);
  return (buffer_appender<char>)
         bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write(OutputIt out, const Char* value) {
  if (!value) {
    FMT_THROW(format_error("string pointer is null"));
  } else {
    auto length = std::char_traits<Char>::length(value);
    out = write(out, basic_string_view<Char>(value, length));
  }
  return out;
}